

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O3

void __thiscall ot::commissioner::JobManager::CancelCommand(JobManager *this)

{
  pointer ppJVar1;
  uint uVar2;
  pointer ppJVar3;
  CommissionerAppPtr commissioner;
  Error error;
  CommissionerAppPtr local_88;
  ErrorCode local_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  _Alloc_hider local_40;
  char local_30 [16];
  
  local_88.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_88.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_70 = 0;
  local_60 = 0;
  local_58[0] = 0;
  ppJVar3 = (this->mJobPool).
            super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppJVar1 = (this->mJobPool).
            super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_68 = local_58;
  while( true ) {
    if (ppJVar3 == ppJVar1) {
      WaitForJobs(this);
      GetSelectedCommissioner((Error *)local_48,this,&local_88);
      local_70 = local_48._0_4_;
      std::__cxx11::string::operator=((string *)&local_68,(string *)&local_40);
      if (local_40._M_p != local_30) {
        operator_delete(local_40._M_p);
      }
      if (local_70 == kNone) {
        uVar2 = (*((local_88.
                    super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])();
        (*((local_88.
            super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           )->super_CommissionerHandler)._vptr_CommissionerHandler[(ulong)(uVar2 & 0xff) + 0xd])();
      }
      if (local_68 != local_58) {
        operator_delete(local_68);
      }
      if (local_88.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      return;
    }
    if (*ppJVar3 == (Job *)0x0) break;
    Job::Cancel(*ppJVar3);
    ppJVar3 = ppJVar3 + 1;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                ,0x284,"void ot::commissioner::JobManager::CancelCommand()");
}

Assistant:

void JobManager::CancelCommand()
{
    CommissionerAppPtr commissioner = nullptr;
    Error              error        = ERROR_NONE;

    for (auto job : mJobPool)
    {
        ASSERT(job != nullptr);
        job->Cancel();
    }
    WaitForJobs();

    error = GetSelectedCommissioner(commissioner);
    if (error == ERROR_NONE)
    {
        if (commissioner->IsActive())
        {
            commissioner->CancelRequests();
        }
        else
        {
            commissioner->Stop();
        }
    }
}